

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandReadJson(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *__filename;
  int iVar1;
  FILE *__stream;
  int c;
  FILE *pFile;
  char *pFileName;
  Abc_Nam_t *pStrs;
  Vec_Wec_t *vObjs;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  vObjs = (Vec_Wec_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argv_local._4_4_,(char **)vObjs,"h");
  if ((iVar1 == -1) && (argv_local._4_4_ == globalUtilOptind + 1)) {
    __filename = *(char **)(&vObjs->nCap + (long)globalUtilOptind * 2);
    __stream = fopen(__filename,"r");
    if (__stream == (FILE *)0x0) {
      fprintf((FILE *)pAStack_18->Err,"Cannot open input file \"%s\". \n",__filename);
      pAbc_local._4_4_ = 1;
    }
    else {
      fclose(__stream);
      pStrs = (Abc_Nam_t *)Json_Read(__filename,(Abc_Nam_t **)&pFileName);
      if (pStrs == (Abc_Nam_t *)0x0) {
        pAbc_local._4_4_ = 0;
      }
      else {
        Abc_FrameSetJsonStrs((Abc_Nam_t *)pFileName);
        Abc_FrameSetJsonObjs((Vec_Wec_t *)pStrs);
        pAbc_local._4_4_ = 0;
      }
    }
  }
  else {
    fprintf((FILE *)pAStack_18->Err,"usage: read_json [-h] <file>\n");
    fprintf((FILE *)pAStack_18->Err,"\t         reads file in JSON format\n");
    fprintf((FILE *)pAStack_18->Err,"\t-h     : prints the command summary\n");
    fprintf((FILE *)pAStack_18->Err,"\tfile   : the name of a file to read\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandReadJson( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Vec_Wec_t * Json_Read( char * pFileName, Abc_Nam_t ** ppStrs );
    Vec_Wec_t * vObjs;
    Abc_Nam_t * pStrs;
    char * pFileName;
    FILE * pFile;
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
    {
        goto usage;
    }

    // get the input file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = fopen( pFileName, "r" )) == NULL )
    {
        fprintf( pAbc->Err, "Cannot open input file \"%s\". \n", pFileName );
        return 1;
    }
    fclose( pFile );

    // set the new network
    vObjs = Json_Read( pFileName, &pStrs );
    if ( vObjs == NULL )
        return 0;
    Abc_FrameSetJsonStrs( pStrs );
    Abc_FrameSetJsonObjs( vObjs );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_json [-h] <file>\n" );
    fprintf( pAbc->Err, "\t         reads file in JSON format\n" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}